

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::RollbackUpdate<short>(UpdateInfo *base_info,UpdateInfo *rollback_info)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = rollback_info->N;
  if ((ulong)uVar1 != 0) {
    uVar2 = base_info->max;
    uVar3 = rollback_info->max;
    lVar5 = 0;
    uVar6 = 0;
    do {
      lVar5 = lVar5 + -1;
      do {
        lVar4 = lVar5;
        lVar5 = lVar4 + 1;
      } while (*(uint *)((long)&base_info[1].segment + lVar4 * 4 + 4) <
               *(uint *)((long)&rollback_info[1].segment + uVar6 * 4));
      *(undefined2 *)((long)&base_info[1].segment + lVar4 * 2 + 2 + (ulong)uVar2 * 4) =
           *(undefined2 *)((long)&rollback_info[1].segment + uVar6 * 2 + (ulong)uVar3 * 4);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar1);
  }
  return;
}

Assistant:

static void RollbackUpdate(UpdateInfo &base_info, UpdateInfo &rollback_info) {
	auto base_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	auto rollback_data = rollback_info.GetData<T>();
	auto rollback_tuples = rollback_info.GetTuples();
	idx_t base_offset = 0;
	for (idx_t i = 0; i < rollback_info.N; i++) {
		auto id = rollback_tuples[i];
		while (base_tuples[base_offset] < id) {
			base_offset++;
			D_ASSERT(base_offset < base_info.N);
		}
		base_data[base_offset] = rollback_data[i];
	}
}